

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O0

float __thiscall sentencepiece::unigram::Lattice::CalculateEntropy(Lattice *this,float inv_theta)

{
  Node *pNVar1;
  bool bVar2;
  value_type vVar3;
  reference ppNVar4;
  const_reference pvVar5;
  reference pvVar6;
  const_reference this_00;
  const_reference ppNVar7;
  vector<float,_std::allocator<float>_> *in_RDI;
  float in_XMM0_Da;
  float fVar8;
  float fVar9;
  double dVar10;
  float lnode_transition_prob;
  Node *lnode;
  const_iterator __end4;
  const_iterator __begin4;
  value_type *__range4;
  Node *rnode;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  int pos;
  vector<float,_std::allocator<float>_> alpha;
  vector<float,_std::allocator<float>_> H;
  int len;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  float fVar11;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
  local_90;
  const_reference local_88;
  Node *local_80;
  Node **local_78;
  __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
  local_70;
  const_reference local_68;
  int local_5c;
  vector<float,_std::allocator<float>_> local_58;
  float in_stack_ffffffffffffffc4;
  Lattice *in_stack_ffffffffffffffc8;
  vector<float,_std::allocator<float>_> local_28;
  int local_10;
  float local_c;
  
  local_c = in_XMM0_Da;
  local_10 = size((Lattice *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  model::FreeList<sentencepiece::unigram::Lattice::Node>::size
            ((FreeList<sentencepiece::unigram::Lattice::Node> *)(in_RDI + 4));
  std::allocator<float>::allocator((allocator<float> *)0x47f301);
  std::vector<float,_std::allocator<float>_>::vector
            (in_RDI,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (value_type_conflict5 *)in_stack_ffffffffffffff30,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::allocator<float>::~allocator((allocator<float> *)0x47f32f);
  ForwardAlgorithm(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  for (local_5c = 0; local_5c <= local_10; local_5c = local_5c + 1) {
    local_68 = std::
               vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
               ::operator[]((vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                             *)(in_RDI + 2),(long)local_5c);
    local_70._M_current =
         (Node **)std::
                  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                  ::begin(in_stack_ffffffffffffff18);
    local_78 = (Node **)std::
                        vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                        ::end(in_stack_ffffffffffffff18);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (__normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                          *)in_stack_ffffffffffffff18);
      if (!bVar2) break;
      ppNVar4 = __gnu_cxx::
                __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                ::operator*(&local_70);
      local_80 = *ppNVar4;
      local_88 = std::
                 vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                 ::operator[]((vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                               *)(in_RDI + 3),(long)local_5c);
      local_90._M_current =
           (Node **)std::
                    vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                    ::begin(in_stack_ffffffffffffff18);
      std::
      vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ::end(in_stack_ffffffffffffff18);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           (__normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                            *)in_stack_ffffffffffffff18);
        if (!bVar2) break;
        ppNVar4 = __gnu_cxx::
                  __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                  ::operator*(&local_90);
        pNVar1 = *ppNVar4;
        fVar11 = pNVar1->score;
        in_stack_ffffffffffffff30 = &local_58;
        fVar8 = local_c;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           (in_stack_ffffffffffffff30,(ulong)pNVar1->node_id);
        fVar8 = fVar8 * fVar11 + *pvVar5;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           (in_stack_ffffffffffffff30,(ulong)local_80->node_id);
        fVar11 = *pvVar5;
        dVar10 = std::exp((double)(ulong)(uint)(fVar8 - fVar11));
        fVar9 = SUB84(dVar10,0);
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&local_28,(ulong)pNVar1->node_id);
        in_stack_ffffffffffffff24 = *pvVar6 + (fVar8 - fVar11);
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&local_28,(ulong)local_80->node_id);
        *pvVar6 = fVar9 * in_stack_ffffffffffffff24 + *pvVar6;
        __gnu_cxx::
        __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
        ::operator++(&local_90);
      }
      __gnu_cxx::
      __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
      ::operator++(&local_70);
    }
  }
  this_00 = std::
            vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
            ::operator[]((vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                          *)(in_RDI + 2),(long)local_10);
  ppNVar7 = std::
            vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
            ::operator[](this_00,0);
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     (&local_28,(ulong)(*ppNVar7)->node_id);
  vVar3 = -*pvVar6;
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffff30);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffff30);
  return vVar3;
}

Assistant:

float Lattice::CalculateEntropy(float inv_theta) const {
  const int len = size();

  // alpha[node_id] is the marginal prob of sequence up to start of node
  // H is entropy of sequence
  // the index of alpha/H is Node::node_id.
  std::vector<float> H(node_allocator_.size(), 0.0);

  // Populate the forward marginals to get the normalising constant
  const auto alpha = ForwardAlgorithm(inv_theta);

  // Now populate the forward entropies
  for (int pos = 0; pos <= len; ++pos) {
    for (Node *rnode : begin_nodes_[pos]) {
      for (Node *lnode : end_nodes_[pos]) {
        // Contribution each lnode makes = p(lnode) * (H(lnode) + log p(lnode))

        // We have to normalise p(lnode) by the marginal contribution it makes
        const float lnode_transition_prob =
            ((inv_theta * lnode->score) + alpha[lnode->node_id] -
             alpha[rnode->node_id]);
        H[rnode->node_id] += std::exp(lnode_transition_prob) *
                             (H[lnode->node_id] + lnode_transition_prob);
      }
    }
  }

  return -H[begin_nodes_[len][0]->node_id];
}